

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  pointer *pppIVar1;
  iterator __position;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  int iVar4;
  ostream *os;
  SectionTracker *pSVar5;
  ostringstream oss;
  undefined1 local_1c8 [32];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  os = std::__ostream_insert<char,std::char_traits<char>>
                 ((ostream *)local_1a8,(sectionInfo->name)._M_dataplus._M_p,
                  (sectionInfo->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(os,"@",1);
  operator<<(os,&sectionInfo->lineInfo);
  std::__cxx11::stringbuf::str();
  pSVar5 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,(string *)local_1c8);
  if ((SectionTracker *)local_1c8._0_8_ != (SectionTracker *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_);
  }
  iVar4 = (*(pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
            super_IShared.super_NonCopyable._vptr_NonCopyable[7])(pSVar5);
  if (SUB41(iVar4,0) != false) {
    __position._M_current =
         (this->m_activeSections).
         super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8._0_8_ = pSVar5;
    if (__position._M_current ==
        (this->m_activeSections).
        super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
      ::_M_realloc_insert<Catch::TestCaseTracking::ITracker*>
                ((vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
                  *)&this->m_activeSections,__position,(ITracker **)local_1c8);
    }
    else {
      *__position._M_current = (ITracker *)pSVar5;
      pppIVar1 = &(this->m_activeSections).
                  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).lineInfo);
    (this->m_lastAssertionInfo).lineInfo.line = (sectionInfo->lineInfo).line;
    pIVar2 = (this->m_reporter).m_p;
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,sectionInfo);
    assertions->failedButOk = (this->m_totals).assertions.failedButOk;
    sVar3 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar3;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return SUB41(iVar4,0);
}

Assistant:

virtual bool sectionStarted (
            SectionInfo const& sectionInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            ITracker& sectionTracker = SectionTracker::acquire( m_trackerContext, oss.str() );
            if( !sectionTracker.isOpen() )
                return false;
            m_activeSections.push_back( &sectionTracker );

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }